

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_type(HSQUIRRELVM v)

{
  SQSharedState *ss;
  SQObjectPtr *this;
  SQChar *s;
  SQString *x;
  SQObjectPtr local_28;
  SQObjectPtr *local_18;
  SQObjectPtr *o;
  HSQUIRRELVM v_local;
  
  o = (SQObjectPtr *)v;
  local_18 = stack_get(v,2);
  this = o;
  ss = (SQSharedState *)o[0x11].super_SQObject._unVal.pTable;
  s = GetTypeName(local_18);
  x = SQString::Create(ss,s,-1);
  SQObjectPtr::SQObjectPtr(&local_28,x);
  SQVM::Push((SQVM *)this,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  return 1;
}

Assistant:

static SQInteger base_type(HSQUIRRELVM v)
{
    SQObjectPtr &o = stack_get(v,2);
    v->Push(SQString::Create(_ss(v),GetTypeName(o),-1));
    return 1;
}